

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O3

void aom_dc_left_predictor_4x4_c(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  int iVar1;
  undefined1 auVar2 [16];
  
  auVar2 = psadbw((undefined1  [16])0x0,ZEXT416(*(uint *)left));
  iVar1 = (auVar2._0_4_ + 2U >> 2 & 0xff) * 0x1010101;
  *(int *)dst = iVar1;
  *(int *)(dst + stride) = iVar1;
  *(int *)(dst + stride * 2) = iVar1;
  *(int *)(dst + stride * 3) = iVar1;
  return;
}

Assistant:

static inline void dc_left_predictor(uint8_t *dst, ptrdiff_t stride, int bw,
                                     int bh, const uint8_t *above,
                                     const uint8_t *left) {
  int i, r, expected_dc, sum = 0;
  (void)above;

  for (i = 0; i < bh; i++) sum += left[i];
  expected_dc = (sum + (bh >> 1)) / bh;

  for (r = 0; r < bh; r++) {
    memset(dst, expected_dc, bw);
    dst += stride;
  }
}